

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O0

bool __thiscall ON_RevSurface::GetSpanVector(ON_RevSurface *this,int dir,double *s)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  int local_34;
  int i;
  double d;
  int span_count;
  bool rc;
  double *s_local;
  int dir_local;
  ON_RevSurface *this_local;
  
  d._7_1_ = false;
  s_local._4_4_ = dir;
  if ((this->m_bTransposed & 1U) != 0) {
    s_local._4_4_ = 1 - dir;
  }
  if ((s_local._4_4_ == 0) && (bVar1 = ON_Interval::IsIncreasing(&this->m_t), bVar1)) {
    iVar2 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x28])();
    if (0 < iVar2) {
      dVar3 = ON_Interval::operator[](&this->m_t,0);
      *s = dVar3;
      for (local_34 = 1; local_34 < iVar2; local_34 = local_34 + 1) {
        dVar3 = ON_Interval::ParameterAt(&this->m_t,(double)local_34 * (1.0 / (double)iVar2));
        s[local_34] = dVar3;
      }
      dVar3 = ON_Interval::operator[](&this->m_t,1);
      s[iVar2] = dVar3;
      d._7_1_ = true;
    }
  }
  else if ((s_local._4_4_ == 1) && (this->m_curve != (ON_Curve *)0x0)) {
    iVar2 = (*(this->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2a])
                      (this->m_curve,s);
    d._7_1_ = (bool)((byte)iVar2 & 1);
  }
  return d._7_1_;
}

Assistant:

bool ON_RevSurface::GetSpanVector( int dir, double* s ) const
{
  bool rc = false;
  if ( m_bTransposed )
    dir = 1-dir;
  if ( dir==0 && m_t.IsIncreasing() ) {
    int span_count = SpanCount(m_bTransposed?1-dir:dir);
    if ( span_count > 0 )
    {
      double d = 1.0/span_count;
      s[0] = m_t[0];
      for ( int i = 1; i < span_count; i++ )
        s[i] = m_t.ParameterAt( i*d );
      s[span_count] = m_t[1];
      rc = true;
    }
  }
  else if ( dir==1 && m_curve ) {
    rc = m_curve->GetSpanVector(s);
  }
  return rc;
}